

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::RestoreOneScope(ByteCodeGenerator *this,ScopeInfo *scopeInfo,FuncInfo *func)

{
  char16 *pcVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ScopeType SVar5;
  Scope *this_00;
  Scope *pSVar6;
  undefined4 *puVar7;
  char16_t *pcVar8;
  Scope *scope;
  FuncInfo *func_local;
  ScopeInfo *scopeInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ByteCodePhase);
  if (bVar3) {
    pcVar1 = func->name;
    uVar4 = Js::ScopeInfo::GetSymbolCount(scopeInfo);
    bVar3 = Js::ScopeInfo::IsObject(scopeInfo);
    pcVar8 = L"";
    if (bVar3) {
      pcVar8 = L"isObject";
    }
    Output::Print(L"\nRestore ScopeInfo: %s #symbols: %d %s\n",pcVar1,(ulong)uVar4,pcVar8);
  }
  this_00 = Js::ScopeInfo::GetScope(scopeInfo);
  Scope::SetFunc(this_00,func);
  SVar5 = Scope::GetScopeType(this_00);
  if (SVar5 - ScopeType_GlobalEvalBlock < 2) {
    pSVar6 = FuncInfo::GetBodyScope(func);
    if (pSVar6 != (Scope *)0x0) {
      pSVar6 = FuncInfo::GetBodyScope(func);
      SVar5 = Scope::GetScopeType(pSVar6);
      if ((SVar5 != ScopeType_Global) ||
         (SVar5 = Scope::GetScopeType(this_00), SVar5 != ScopeType_GlobalEvalBlock)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x448,
                           "(func->GetBodyScope() == nullptr || (func->GetBodyScope()->GetScopeType() == ScopeType_Global && scope->GetScopeType() == ScopeType_GlobalEvalBlock))"
                           ,
                           "func->GetBodyScope() == nullptr || (func->GetBodyScope()->GetScopeType() == ScopeType_Global && scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    FuncInfo::SetBodyScope(func,this_00);
    bVar3 = Js::ScopeInfo::IsCached(scopeInfo);
    FuncInfo::SetHasCachedScope(func,bVar3);
  }
  else if (SVar5 == ScopeType_FuncExpr) {
    pSVar6 = FuncInfo::GetFuncExprScope(func);
    if (pSVar6 != (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x442,"(func->GetFuncExprScope() == nullptr)",
                         "func->GetFuncExprScope() == nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    FuncInfo::SetFuncExprScope(func,this_00);
  }
  else if (SVar5 == ScopeType_Parameter) {
    pSVar6 = FuncInfo::GetParamScope(func);
    if (pSVar6 != (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x43d,"(func->GetParamScope() == nullptr)",
                         "func->GetParamScope() == nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    FuncInfo::SetParamScope(func,this_00);
  }
  bVar3 = Js::ScopeInfo::IsCached(scopeInfo);
  if ((bVar3) && (pSVar6 = FuncInfo::GetBodyScope(func), this_00 != pSVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x44e,"(!scopeInfo->IsCached() || scope == func->GetBodyScope())",
                       "!scopeInfo->IsCached() || scope == func->GetBodyScope()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  Js::ScopeInfo::SetScope(scopeInfo,(Scope *)0x0);
  PushScope(this,this_00);
  return;
}

Assistant:

void ByteCodeGenerator::RestoreOneScope(Js::ScopeInfo * scopeInfo, FuncInfo * func)
{
    TRACE_BYTECODE(_u("\nRestore ScopeInfo: %s #symbols: %d %s\n"),
        func->name, scopeInfo->GetSymbolCount(), scopeInfo->IsObject() ? _u("isObject") : _u(""));

    Scope * scope = scopeInfo->GetScope();

    scope->SetFunc(func);

    switch (scope->GetScopeType())
    {
        case ScopeType_Parameter:
            Assert(func->GetParamScope() == nullptr);
            func->SetParamScope(scope);
            break;

        case ScopeType_FuncExpr:
            Assert(func->GetFuncExprScope() == nullptr);
            func->SetFuncExprScope(scope);
            break;

        case ScopeType_FunctionBody:
        case ScopeType_GlobalEvalBlock:
            Assert(func->GetBodyScope() == nullptr || (func->GetBodyScope()->GetScopeType() == ScopeType_Global && scope->GetScopeType() == ScopeType_GlobalEvalBlock));
            func->SetBodyScope(scope);
            func->SetHasCachedScope(scopeInfo->IsCached());
            break;
    }
    
    Assert(!scopeInfo->IsCached() || scope == func->GetBodyScope());

    // scopeInfo->scope was created/saved during parsing.
    // We no longer need it by now.
    // Clear it to avoid GC false positive (arena memory later used by GC).
    scopeInfo->SetScope(nullptr);
    this->PushScope(scope);
}